

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CIF::Utilities::split
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *s,string *delims)

{
  long lVar1;
  ulong uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elems;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uVar2 = 0;
  do {
    do {
      lVar1 = std::__cxx11::string::find_first_not_of
                        ((char *)s,(ulong)(delims->_M_dataplus)._M_p,uVar2);
      uVar2 = std::__cxx11::string::find_first_of
                        ((char *)s,(ulong)(delims->_M_dataplus)._M_p,lVar1 + 1);
      std::__cxx11::string::substr((ulong)&local_68,(ulong)s);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 &local_68);
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_68._M_dataplus._M_p == &local_68.field_2);
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  } while( true );
}

Assistant:

std::vector<std::string> split(const std::string &s, std::string delims) {
        size_t beg, pos = 0;
        std::vector<std::string> elems;
        while ((beg = s.find_first_not_of(delims, pos)) != std::string::npos)
        {
            pos = s.find_first_of(delims, beg + 1);
            elems.push_back(s.substr(beg, pos - beg));
        }
    }